

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O2

timer_thread_unique_ptr_t __thiscall
so_5::create_timer_heap_thread(so_5 *this,error_logger_shptr_t *logger)

{
  __shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>
            );
  create_timer_heap_thread(this,(error_logger_shptr_t *)&local_20,0x40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return (__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
          )(__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
            )this;
}

Assistant:

SO_5_FUNC timer_thread_unique_ptr_t
create_timer_heap_thread(
	error_logger_shptr_t logger )
	{
		using timertt_thread_t = timers_details::timer_heap_thread_t;

		return create_timer_heap_thread(
				logger,
				timertt_thread_t::default_initial_heap_capacity() );
	}